

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

bool __thiscall
VulkanHppGenerator::checkEquivalentSingularConstructor
          (VulkanHppGenerator *this,
          vector<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>_>_>
          *constructorIts,const_iterator constructorIt,const_iterator lenIt)

{
  bool bVar1;
  anon_class_16_2_e5f636e4 isEquivalentSingularConstructor;
  vector<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>_>_>
  *constructorIts_local;
  VulkanHppGenerator *this_local;
  const_iterator lenIt_local;
  const_iterator constructorIt_local;
  
  bVar1 = std::ranges::__any_of_fn::
          operator()<const_std::vector<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>_>_>_&,_std::identity,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_KhronosGroup[P]Vulkan_Hpp_VulkanHppGenerator_cpp:940:42)>
                    ((__any_of_fn *)&std::ranges::any_of,constructorIts,constructorIt._M_node,
                     lenIt._M_current);
  return bVar1;
}

Assistant:

bool VulkanHppGenerator::checkEquivalentSingularConstructor( std::vector<std::map<std::string, CommandData>::const_iterator> const & constructorIts,
                                                             std::map<std::string, CommandData>::const_iterator                      constructorIt,
                                                             std::vector<ParamData>::const_iterator                                  lenIt ) const
{
  // check, if there is no singular constructor with the very same arguments as this array constructor
  // (besides the size, of course)
  auto isEquivalentSingularConstructor = [constructorIt, lenIt]( std::map<std::string, CommandData>::const_iterator it )
  {
    if ( it->second.params.size() + 1 != constructorIt->second.params.size() )
    {
      return false;
    }
    const size_t lenIdx = std::distance( constructorIt->second.params.begin(), lenIt );
    for ( size_t i = 0, j = 0; i < it->second.params.size(); ++i, ++j )
    {
      assert( j < constructorIt->second.params.size() );
      if ( j == lenIdx )
      {
        ++j;
      }
      if ( it->second.params[i].type.type != constructorIt->second.params[j].type.type )
      {
        return false;
      }
    }
    return true;
  };
  return ( std::ranges::any_of( constructorIts, isEquivalentSingularConstructor ) );
}